

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::WireType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  string *psVar1;
  AlphaNum local_70;
  undefined8 local_40;
  char *local_38;
  
  local_40 = 0x29;
  local_38 = "com.google.protobuf.WireFormat.FieldType.";
  local_70.piece_ = FieldTypeName((Type)this & 0xff);
  psVar1 = absl::lts_20250127::StrCat_abi_cxx11_
                     (__return_storage_ptr__,(lts_20250127 *)&local_40,&local_70,&local_70);
  return psVar1;
}

Assistant:

std::string WireType(const FieldDescriptor* field) {
  return absl::StrCat("com.google.protobuf.WireFormat.FieldType.",
                      FieldTypeName(field->type()));
}